

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

_Bool multipleOfPowerOf5(uint64_t value,uint32_t p)

{
  uint32_t uVar1;
  uint32_t p_local;
  uint64_t value_local;
  
  uVar1 = pow5Factor(value);
  return p <= uVar1;
}

Assistant:

static inline bool multipleOfPowerOf5(const uint64_t value, const uint32_t p) {
	// I tried a case distinction on p, but there was no performance difference.
	return pow5Factor(value) >= p;
}